

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O3

void __thiscall musicBlock::OPLplayNote(musicBlock *this,uint channel,uchar note,int volume)

{
  uint slot;
  uint uVar1;
  OP2instrEntry *pOVar2;
  
  if (volume == 0) {
    OPLreleaseNote(this,channel,note);
    return;
  }
  if (channel == 0xf) {
    if ((byte)(note + 0xae) < 0xd1) {
      return;
    }
    uVar1 = note + 0x5d & 0xff;
  }
  else {
    uVar1 = (this->driverdata).channelInstr[channel];
  }
  pOVar2 = this->OPLinstruments;
  if (pOVar2 != (OP2instrEntry *)0x0) {
    slot = findFreeChannel(this,(uint)(channel == 0xf) * 2,channel,note);
    if (slot != 0xffffffff) {
      pOVar2 = pOVar2 + uVar1;
      occupyChannel(this,slot,channel,(uint)note,volume,pOVar2,'\0');
      if ((((pOVar2->flags & 4) != 0) && (opl_singlevoice.Value == false)) &&
         (uVar1 = findFreeChannel(this,(uint)(channel == 0xf) * 2 + 1,channel,note),
         uVar1 != 0xffffffff)) {
        occupyChannel(this,uVar1,channel,(uint)note,volume,pOVar2,'\x01');
      }
    }
  }
  return;
}

Assistant:

void musicBlock::OPLplayNote(uint channel, uchar note, int volume)
{
	int i;
	struct OP2instrEntry *instr;

	if (volume == 0)
	{
		OPLreleaseNote (channel, note);
		return;
	}

	if ( (instr = getInstrument(channel, note)) == NULL )
		return;

	if ( (i = findFreeChannel((channel == PERCUSSION) ? 2 : 0, channel, note)) != -1)
	{
		occupyChannel(i, channel, note, volume, instr, 0);
		if ((instr->flags & FL_DOUBLE_VOICE) && !opl_singlevoice)
		{
			if ( (i = findFreeChannel((channel == PERCUSSION) ? 3 : 1, channel, note)) != -1)
				occupyChannel(i, channel, note, volume, instr, 1);
		}
	}
}